

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O0

Account * __thiscall Account::GetCharacterList_abi_cxx11_(Account *this)

{
  bool bVar1;
  reference pbVar2;
  ostream *poVar3;
  long in_RSI;
  string local_1e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> char_name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  stringstream local_1a0 [4];
  int count;
  stringstream ss;
  ostream local_190 [384];
  Account *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x30));
  local_1c0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RSI + 0x30));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_1c0);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_1e0,(string *)pbVar2);
    __range1._4_4_ = __range1._4_4_ + 1;
    poVar3 = (ostream *)std::ostream::operator<<(local_190,__range1._4_4_);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,local_1e0);
    std::operator<<(poVar3,"\r\n");
    std::__cxx11::string::~string(local_1e0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string Account::GetCharacterList() {
    std::stringstream ss;
    int count = 0;
    for(auto char_name: m_characters) {
        ss << ++count << " " << char_name << "\r\n";
    }
    return ss.str();
}